

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O1

RAMReport * npas4::GetRAMReport(void)

{
  int64_t iVar1;
  int64_t iVar2;
  RAMReport *in_RDI;
  sysinfo memInfo;
  sysinfo local_80;
  
  in_RDI->RamVirtualAvailable = 0;
  in_RDI->RamVirtualUsed = 0;
  in_RDI->RamPhysicalUsedByCurrentProcessPeak = 0;
  in_RDI->RamVirtualTotal = 0;
  in_RDI->RamPhysicalUsed = 0;
  in_RDI->RamPhysicalUsedByCurrentProcess = 0;
  in_RDI->RamPhysicalTotal = 0;
  in_RDI->RamPhysicalAvailable = 0;
  in_RDI->RamSystemUsed = 0;
  in_RDI->RamSystemUsedByCurrentProcess = 0;
  in_RDI->RamSystemTotal = 0;
  in_RDI->RamSystemAvailable = 0;
  in_RDI->RamVirtualUsedByCurrentProcess = 0;
  sysinfo(&local_80);
  in_RDI->RamSystemTotal =
       (ulong)local_80.mem_unit * (local_80.totalswap + local_80.totalram + local_80.totalhigh);
  iVar1 = GetRAMSystemAvailable();
  in_RDI->RamSystemAvailable = iVar1;
  iVar1 = GetRAMSystemUsed();
  in_RDI->RamSystemUsed = iVar1;
  iVar1 = GetRAMPhysicalUsedByCurrentProcess();
  iVar2 = GetRAMVirtualUsedByCurrentProcess();
  in_RDI->RamSystemUsedByCurrentProcess = iVar2 + iVar1;
  sysinfo(&local_80);
  in_RDI->RamPhysicalTotal = local_80.mem_unit * local_80.totalram;
  iVar1 = GetRAMPhysicalAvailable();
  in_RDI->RamPhysicalAvailable = iVar1;
  sysinfo(&local_80);
  in_RDI->RamPhysicalUsed = (ulong)local_80.mem_unit * (local_80.totalram - local_80.freeram);
  iVar1 = GetRAMPhysicalUsedByCurrentProcess();
  in_RDI->RamPhysicalUsedByCurrentProcess = iVar1;
  sysinfo(&local_80);
  in_RDI->RamVirtualTotal = local_80.mem_unit * local_80.totalswap;
  iVar1 = GetRAMVirtualAvailable();
  in_RDI->RamVirtualAvailable = iVar1;
  sysinfo(&local_80);
  in_RDI->RamVirtualUsed = (ulong)local_80.mem_unit * (local_80.totalswap - local_80.freeswap);
  iVar1 = GetRAMVirtualUsedByCurrentProcess();
  in_RDI->RamVirtualUsedByCurrentProcess = iVar1;
  return in_RDI;
}

Assistant:

npas4::RAMReport npas4::GetRAMReport()
{
	npas4::RAMReport r;
	r.RamSystemTotal = GetRAMSystemTotal();
	r.RamSystemAvailable = GetRAMSystemAvailable();
	r.RamSystemUsed = GetRAMSystemUsed();
	r.RamSystemUsedByCurrentProcess = GetRAMSystemUsedByCurrentProcess();
	r.RamPhysicalTotal = GetRAMPhysicalTotal();
	r.RamPhysicalAvailable = GetRAMPhysicalAvailable();
	r.RamPhysicalUsed = GetRAMPhysicalUsed();
	r.RamPhysicalUsedByCurrentProcess = GetRAMPhysicalUsedByCurrentProcess();
	r.RamVirtualTotal = GetRAMVirtualTotal();
	r.RamVirtualAvailable = GetRAMVirtualAvailable();
	r.RamVirtualUsed = GetRAMVirtualUsed();
	r.RamVirtualUsedByCurrentProcess = GetRAMVirtualUsedByCurrentProcess();
	return r;
}